

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O0

void __thiscall cmCTestCurl::SetProxyType(cmCTestCurl *this)

{
  bool bVar1;
  undefined1 local_80 [8];
  string passwd;
  string type;
  undefined1 local_30 [8];
  string port;
  cmCTestCurl *this_local;
  
  port.field_2._8_8_ = this;
  std::__cxx11::string::clear();
  this->HTTPProxyType = CURLPROXY_HTTP;
  std::__cxx11::string::clear();
  bVar1 = cmsys::SystemTools::GetEnv("HTTP_PROXY",&this->HTTPProxy);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_30);
    bVar1 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT",(string *)local_30);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)&this->HTTPProxy,":");
      std::__cxx11::string::operator+=((string *)&this->HTTPProxy,(string *)local_30);
    }
    std::__cxx11::string::string((string *)(passwd.field_2._M_local_buf + 8));
    bVar1 = cmsys::SystemTools::GetEnv
                      ("HTTP_PROXY_TYPE",(string *)(passwd.field_2._M_local_buf + 8));
    if (bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&passwd.field_2 + 8),"HTTP");
      if (bVar1) {
        this->HTTPProxyType = CURLPROXY_HTTP;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&passwd.field_2 + 8),"SOCKS4");
        if (bVar1) {
          this->HTTPProxyType = CURLPROXY_SOCKS4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&passwd.field_2 + 8),"SOCKS5");
          if (bVar1) {
            this->HTTPProxyType = CURLPROXY_SOCKS5;
          }
        }
      }
    }
    cmsys::SystemTools::GetEnv("HTTP_PROXY_USER",&this->HTTPProxyAuth);
    std::__cxx11::string::string((string *)local_80);
    bVar1 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD",(string *)local_80);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)&this->HTTPProxyAuth,":");
      std::__cxx11::string::operator+=((string *)&this->HTTPProxyAuth,(string *)local_80);
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(passwd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void cmCTestCurl::SetProxyType()
{
  this->HTTPProxy.clear();
  // this is the default
  this->HTTPProxyType = CURLPROXY_HTTP;
  this->HTTPProxyAuth.clear();
  if (cmSystemTools::GetEnv("HTTP_PROXY", this->HTTPProxy)) {
    std::string port;
    if (cmSystemTools::GetEnv("HTTP_PROXY_PORT", port)) {
      this->HTTPProxy += ":";
      this->HTTPProxy += port;
    }
    std::string type;
    if (cmSystemTools::GetEnv("HTTP_PROXY_TYPE", type)) {
      // HTTP/SOCKS4/SOCKS5
      if (type == "HTTP") {
        this->HTTPProxyType = CURLPROXY_HTTP;
      } else if (type == "SOCKS4") {
        this->HTTPProxyType = CURLPROXY_SOCKS4;
      } else if (type == "SOCKS5") {
        this->HTTPProxyType = CURLPROXY_SOCKS5;
      }
    }
    cmSystemTools::GetEnv("HTTP_PROXY_USER", this->HTTPProxyAuth);
    std::string passwd;
    if (cmSystemTools::GetEnv("HTTP_PROXY_PASSWD", passwd)) {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += passwd;
    }
  }
}